

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5TextureGatherOffset.cpp
# Opt level: O2

void __thiscall
glcts::GPUShader5TextureGatherOffsetTestBase::prepareVertexBufferInfoForCoordinates
          (GPUShader5TextureGatherOffsetTestBase *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint i;
  int iVar6;
  uint uVar7;
  VertexBufferInfo info;
  
  uVar7 = this->m_is_texture_array | 2;
  this->m_n_coordinates_components = uVar7;
  std::vector<float,_std::allocator<float>_>::resize
            (&this->m_coordinates_buffer_data,(ulong)(uVar7 << 7));
  bVar1 = this->m_is_texture_array;
  info.data = (this->m_coordinates_buffer_data).super__Vector_base<float,_std::allocator<float>_>.
              _M_impl.super__Vector_impl_data._M_start;
  *(float *)((long)info.data + 0) = 0.0;
  *(float *)((long)info.data + 4) = 0.0;
  if (bVar1 == true) {
    *(float *)((long)info.data + 8) = 0.0;
    uVar7 = this->m_n_coordinates_components;
    uVar4 = (ulong)uVar7;
    *(float *)((long)info.data + uVar4 * 4) = 0.0;
    *(float *)((long)info.data + (ulong)(uVar7 + 1) * 4) = 1.0;
    *(float *)((long)info.data + (ulong)(uVar7 + 2) * 4) = 1.0;
    ((pointer)((long)info.data + (ulong)(uVar7 * 2) * 4))[0] = 1.0;
    ((pointer)((long)info.data + (ulong)(uVar7 * 2) * 4))[1] = 0.0;
    *(float *)((long)info.data + (ulong)(uVar7 * 2 + 2) * 4) = 2.0;
    *(float *)((long)info.data + (ulong)(uVar7 * 3) * 4) = 1.0;
    *(float *)((long)info.data + (uVar4 * 3 + 1 & 0xffffffff) * 4) = 1.0;
    *(float *)((long)info.data + (uVar4 * 3 + 2 & 0xffffffff) * 4) = 3.0;
    iVar6 = 4;
    while( true ) {
      info.n_components = (GLuint)uVar4;
      if (iVar6 == 0x80) break;
      iVar2 = rand();
      iVar3 = rand();
      uVar7 = rand();
      uVar4 = (ulong)this->m_n_coordinates_components;
      uVar5 = this->m_n_coordinates_components * iVar6;
      info.data = (this->m_coordinates_buffer_data).
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start;
      *(float *)((long)info.data + (ulong)uVar5 * 4) = (float)(iVar2 % 0x4000) * 0.0009765625 + -8.0
      ;
      *(float *)((long)info.data + (ulong)(uVar5 + 1) * 4) =
           (float)(iVar3 % 0x4000) * 0.0009765625 + -8.0;
      *(float *)((long)info.data + (ulong)(uVar5 + 2) * 4) =
           (float)((uVar7 & 3) << 10) * 0.0009765625;
      iVar6 = iVar6 + 1;
    }
  }
  else {
    uVar7 = this->m_n_coordinates_components;
    uVar4 = (ulong)uVar7;
    *(float *)((long)info.data + uVar4 * 4) = 0.0;
    *(float *)((long)info.data + (ulong)(uVar7 + 1) * 4) = 1.0;
    ((pointer)((long)info.data + (ulong)(uVar7 * 2) * 4))[0] = 1.0;
    ((pointer)((long)info.data + (ulong)(uVar7 * 2) * 4))[1] = 0.0;
    *(float *)((long)info.data + (ulong)(uVar7 * 3) * 4) = 1.0;
    *(float *)((long)info.data + (uVar4 * 3 + 1 & 0xffffffff) * 4) = 1.0;
    iVar6 = 4;
    while( true ) {
      info.n_components = (GLuint)uVar4;
      if (iVar6 == 0x80) break;
      iVar2 = rand();
      iVar3 = rand();
      uVar4 = (ulong)this->m_n_coordinates_components;
      uVar7 = this->m_n_coordinates_components * iVar6;
      info.data = (this->m_coordinates_buffer_data).
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start;
      *(float *)((long)info.data + (ulong)uVar7 * 4) = (float)(iVar2 % 0x4000) * 0.0009765625 + -8.0
      ;
      *(float *)((long)info.data + (ulong)(uVar7 + 1) * 4) =
           (float)(iVar3 % 0x4000) * 0.0009765625 + -8.0;
      iVar6 = iVar6 + 1;
    }
  }
  info.attribute_name = "texCoords";
  info.type = 0x1406;
  info.data_size =
       *(int *)&(this->m_coordinates_buffer_data).super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_finish - (int)info.data & 0xfffffffc;
  std::
  vector<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo,_std::allocator<glcts::GPUShader5TextureGatherOffsetTestBase::VertexBufferInfo>_>
  ::push_back(&this->m_vertex_buffer_infos,&info);
  return;
}

Assistant:

void GPUShader5TextureGatherOffsetTestBase::prepareVertexBufferInfoForCoordinates()
{
	/* Select proper number of components */
	if (true == m_is_texture_array)
	{
		m_n_coordinates_components = 3;
	}
	else
	{
		m_n_coordinates_components = 2;
	}

	/* Prepare storage for texture coordinates */
	m_coordinates_buffer_data.resize(m_n_vertices * m_n_coordinates_components);

	/* Variables for calculation of texture coordiantes' range and offsets */
	const float coordinate_denominator = m_coordinate_resolution;
	int			x_modulus;
	float		x_offset;
	float		x_range;
	int			y_modulus;
	float		y_offset;
	float		y_range;

	/* Calculation of texture coordiantes' range and offsets */
	x_range = m_max_coordinate_value - m_min_coordinate_value;
	y_range = m_max_coordinate_value - m_min_coordinate_value;

	x_offset = m_min_coordinate_value;
	y_offset = m_min_coordinate_value;

	x_range *= coordinate_denominator;
	y_range *= coordinate_denominator;

	x_modulus = (int)x_range;
	y_modulus = (int)y_range;

	/* Prepare texture coordinates */
	if (true == m_is_texture_array)
	{
		/* First four coordinates are corners, each comes from unique level */
		setCoordinatesData(0.0f, 0.0f, 0.0f, 0);
		setCoordinatesData(0.0f, 1.0f, 1.0f, 1);
		setCoordinatesData(1.0f, 0.0f, 2.0f, 2);
		setCoordinatesData(1.0f, 1.0f, 3.0f, 3);

		/* Generate rest of texture coordinates */
		for (unsigned int i = 4; i < m_n_vertices; ++i)
		{
			const glw::GLfloat coord_x = ((float)(rand() % x_modulus)) / coordinate_denominator + x_offset;
			const glw::GLfloat coord_y = ((float)(rand() % y_modulus)) / coordinate_denominator + y_offset;
			const glw::GLfloat coord_z =
				((float)(rand() % m_n_texture_array_length * m_coordinate_resolution)) / coordinate_denominator;

			setCoordinatesData(coord_x, coord_y, coord_z, i);
		}
	}
	else
	{
		/* First four coordinates are corners */
		setCoordinatesData(0.0f, 0.0f, 0);
		setCoordinatesData(0.0f, 1.0f, 1);
		setCoordinatesData(1.0f, 0.0f, 2);
		setCoordinatesData(1.0f, 1.0f, 3);

		/* Generate rest of texture coordinates */
		for (unsigned int i = 4; i < m_n_vertices; ++i)
		{
			const glw::GLfloat coord_x = ((float)(rand() % x_modulus)) / coordinate_denominator + x_offset;
			const glw::GLfloat coord_y = ((float)(rand() % y_modulus)) / coordinate_denominator + y_offset;

			setCoordinatesData(coord_x, coord_y, i);
		}
	}

	/* Setup coordinates VB info */
	VertexBufferInfo info;

	info.attribute_name = m_coordinates_attribute_name;
	info.n_components   = m_n_coordinates_components;
	info.type			= GL_FLOAT;
	info.data			= &m_coordinates_buffer_data[0];
	info.data_size		= (glw::GLuint)(m_coordinates_buffer_data.size() * sizeof(glw::GLfloat));

	/* Store results */
	m_vertex_buffer_infos.push_back(info);
}